

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

string * __thiscall
Assimp::ColladaParser::ReadZaeManifest_abi_cxx11_
          (string *__return_storage_ptr__,ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pIVar4;
  reference pvVar5;
  CIrrXML_IOStreamReader *this_00;
  pointer callback;
  IrrXMLReader *__p;
  pointer pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  allocator<char> local_4b2;
  allocator<char> local_4b1;
  string local_4b0;
  undefined1 local_48c [8];
  aiString ai_str;
  char *filepath;
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  manifest_reader;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  mIOWrapper;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> manifestfile;
  ZipArchiveIOSystem *zip_archive_local;
  
  pIVar4 = (pointer)(**(code **)(*(long *)&this->mFileName + 0x20))(this,"manifest.xml","rb");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)
             &file_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar4);
  bVar1 = std::operator==((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                          &file_list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dae",&local_59);
    ZipArchiveIOSystem::getFileListExtension
              ((ZipArchiveIOSystem *)this,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
    goto LAB_0066f4d9;
  }
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                     ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                      &file_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,pIVar4);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
  unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
            ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
              *)&manifest_reader,this_00);
  callback = std::
             unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
             ::get((unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                    *)&manifest_reader);
  __p = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
  std::
  unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
  ::unique_ptr<std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>,void>
            ((unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
              *)&filepath,__p);
  do {
    do {
      pIVar6 = std::
               unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
               ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                             *)&filepath);
      uVar2 = (*pIVar6->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        goto LAB_0066f4b1;
      }
      pIVar6 = std::
               unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
               ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                             *)&filepath);
      iVar3 = (*pIVar6->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 1);
    pIVar6 = std::
             unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
             ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                           *)&filepath);
    iVar3 = (*pIVar6->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"dae_root");
  } while (iVar3 != 0);
  pIVar6 = std::
           unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
           ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                         *)&filepath);
  uVar2 = (*pIVar6->_vptr_IIrrXMLReader[2])();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pIVar6 = std::
             unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
             ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                           *)&filepath);
    iVar3 = (*pIVar6->_vptr_IIrrXMLReader[3])();
    if (iVar3 != 3) {
      pIVar6 = std::
               unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
               ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                             *)&filepath);
      iVar3 = (*pIVar6->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 5) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        goto LAB_0066f4b1;
      }
    }
    pIVar6 = std::
             unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
             ::operator->((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                           *)&filepath);
    iVar3 = (*pIVar6->_vptr_IIrrXMLReader[0xe])();
    pcVar7 = (char *)CONCAT44(extraout_var_00,iVar3);
    ai_str.data._1016_8_ = pcVar7;
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,pcVar7,&local_4b1);
      aiString::aiString((aiString *)local_48c,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      UriDecodePath((aiString *)local_48c);
      pcVar7 = aiString::C_Str((aiString *)local_48c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar7,&local_4b2);
      std::allocator<char>::~allocator(&local_4b2);
    }
  }
LAB_0066f4b1:
  std::
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  ::~unique_ptr((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                 *)&filepath);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>::
  ~unique_ptr((unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
               *)&manifest_reader);
LAB_0066f4d9:
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
            ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
             &file_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaParser::ReadZaeManifest(ZipArchiveIOSystem &zip_archive) {
    // Open the manifest
    std::unique_ptr<IOStream> manifestfile(zip_archive.Open("manifest.xml"));
    if (manifestfile == nullptr)
    {
        // No manifest, hope there is only one .DAE inside
        std::vector<std::string> file_list;
        zip_archive.getFileListExtension(file_list, "dae");

        if (file_list.empty())
            return std::string();

        return file_list.front();
    }

    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(manifestfile.get()));
    std::unique_ptr<irr::io::IrrXMLReader> manifest_reader(irr::io::createIrrXMLReader(mIOWrapper.get()));

    while (manifest_reader->read())
    {
        // find the manifest "dae_root" element
        if (manifest_reader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (::strcmp(manifest_reader->getNodeName(), "dae_root") == 0)
            {
                if (!manifest_reader->read())
                    return std::string();
                if (manifest_reader->getNodeType() != irr::io::EXN_TEXT && manifest_reader->getNodeType() != irr::io::EXN_CDATA)
                    return std::string();

                const char* filepath = manifest_reader->getNodeData();
                if (filepath == nullptr)
                    return std::string();

                aiString ai_str(filepath);
                UriDecodePath(ai_str);

                return std::string(ai_str.C_Str());
            }
        }
    }
    return std::string();
}